

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_top_n.cpp
# Opt level: O1

unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true> __thiscall
duckdb::PhysicalTopN::GetGlobalSinkState(PhysicalTopN *this,ClientContext *context)

{
  DynamicFilterData *this_00;
  TopNGlobalSinkState *this_01;
  ClientContext *in_RDX;
  
  if ((context->config).profiler_settings._M_h._M_rehash_policy._M_next_resize != 0) {
    this_00 = shared_ptr<duckdb::DynamicFilterData,_true>::operator->
                        ((shared_ptr<duckdb::DynamicFilterData,_true> *)
                         &(context->config).profiler_settings._M_h._M_rehash_policy._M_next_resize);
    DynamicFilterData::Reset(this_00);
  }
  this_01 = (TopNGlobalSinkState *)operator_new(0x458);
  TopNGlobalSinkState::TopNGlobalSinkState(this_01,in_RDX,(PhysicalTopN *)context);
  (this->super_PhysicalOperator)._vptr_PhysicalOperator = (_func_int **)this_01;
  return (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)
         (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)this;
}

Assistant:

unique_ptr<GlobalSinkState> PhysicalTopN::GetGlobalSinkState(ClientContext &context) const {
	if (dynamic_filter) {
		dynamic_filter->Reset();
	}
	return make_uniq<TopNGlobalSinkState>(context, *this);
}